

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro_expander.cpp
# Opt level: O2

bool __thiscall
skiwi::anon_unknown_26::macro_expander_visitor::_previsit
          (macro_expander_visitor *this,Expression *e)

{
  int iVar1;
  int iVar2;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *__v;
  macro_data *this_00;
  variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
  *pvVar3;
  variant_alternative_t<5UL,_variant<Begin,_Case,_Cond,_Do,_ForeignCall,_FunCall,_If,_Lambda,_Let,_variant<Character,_False,_Fixnum,_Flonum,_Nil,_String,_Symbol,_True>,_Nop,_PrimitiveCall,_Quote,_Set,_Variable>_>
  *pvVar4;
  variant_alternative_t<14UL,_variant<Begin,_Case,_Cond,_Do,_ForeignCall,_FunCall,_If,_Lambda,_Let,_variant<Character,_False,_Fixnum,_Flonum,_Nil,_String,_Symbol,_True>,_Nop,_PrimitiveCall,_Quote,_Set,_Variable>_>
  *pvVar5;
  iterator iVar6;
  ulong uVar7;
  code *pcVar8;
  uint64_t rax;
  ulong uVar9;
  string *extra;
  variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
  *this_01;
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens_1;
  uint64_t fie_size;
  __shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2> local_df8;
  vector<skiwi::token,_std::allocator<skiwi::token>_> tokens;
  string script;
  asmcode code;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
  externals;
  undefined1 local_d00 [40];
  size_type local_cd8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_cd0;
  size_type local_cc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_cb8;
  Program pr;
  string local_c40;
  string local_c20;
  macro_data md;
  first_pass_data d;
  Quote q;
  runtime_error er;
  ostream local_9b0 [2432];
  
  if ((e->
      super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ).
      super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ._M_index != '\x05') {
    return true;
  }
  pvVar4 = std::
           get<5ul,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (e);
  __v = (pvVar4->fun).
        super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((__v->
      super__Variant_base<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ).
      super__Move_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Copy_assign_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Move_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Copy_ctor_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      .
      super__Variant_storage_alias<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ._M_index != '\x0e') {
    return true;
  }
  this_00 = this->p_md;
  pvVar5 = std::
           get<14ul,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                     (__v);
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::macro_entry>_>_>
                  *)this_00,&pvVar5->name);
  if ((_Rb_tree_header *)iVar6._M_node == &(this->p_md->m)._M_t._M_impl.super__Rb_tree_header) {
    return true;
  }
  uVar9 = (long)iVar6._M_node[3]._M_parent - *(long *)(iVar6._M_node + 3) >> 5;
  uVar7 = ((long)(pvVar4->arguments).
                 super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar4->arguments).
                super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xf0;
  if (*(char *)&iVar6._M_node[3]._M_right == '\0') {
    if (uVar9 == uVar7) goto LAB_002072e9;
    iVar1 = pvVar4->line_nr;
    iVar2 = pvVar4->column_nr;
    extra = &local_c20;
    std::__cxx11::string::string((string *)extra,(string *)(iVar6._M_node + 1));
    throw_error(iVar1,iVar2,&pvVar4->filename,macro_invalid_pattern,extra);
  }
  else {
    if (uVar9 <= uVar7 + 1) goto LAB_002072e9;
    iVar1 = pvVar4->line_nr;
    iVar2 = pvVar4->column_nr;
    extra = &local_c40;
    std::__cxx11::string::string((string *)extra,(string *)(iVar6._M_node + 1));
    throw_error(iVar1,iVar2,&pvVar4->filename,macro_invalid_pattern,extra);
  }
  std::__cxx11::string::~string((string *)extra);
LAB_002072e9:
  this->macros_expanded = true;
  pvVar3 = (variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
            *)(pvVar4->arguments).
              super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                  *)(pvVar4->arguments).
                    super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; this_01 != pvVar3;
      this_01 = this_01 + 0xf0) {
    Quote::Quote(&q);
    std::__cxx11::stringstream::stringstream((stringstream *)&er);
    dump(local_9b0,(Expression *)this_01,false);
    std::__cxx11::stringbuf::str();
    tokenize(&tokens,(string *)&pr);
    std::__cxx11::string::~string((string *)&pr);
    std::
    __reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
              (tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
               super__Vector_impl_data._M_start,
               tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
               super__Vector_impl_data._M_finish);
    read_from((cell *)&d,&tokens,true);
    std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&tokens);
    std::__cxx11::stringstream::~stringstream((stringstream *)&er);
    cell::operator=(&q.arg,(cell *)&d);
    cell::~cell((cell *)&d);
    std::
    variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
    ::operator=(this_01,&q);
    Quote::~Quote(&q);
  }
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header;
  pr.expressions.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pr.expressions.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pr.expressions.
  super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ = 0;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_node_count._6_2_ = 0;
  pr.alpha_converted = false;
  pr.assignable_variables_converted = false;
  pr.define_converted = false;
  pr.closure_converted = false;
  pr.cps_converted = false;
  pr.free_variables_analysed = false;
  pr.linear_scan_indices_computed = false;
  pr.lambda_to_let_converted = false;
  pr.include_handled = false;
  pr.simplified_to_core_forms = false;
  pr.single_begin_conversion = false;
  pr.tail_call_analysis = false;
  pr.global_define_env_allocated = false;
  pr.quotes_collected = false;
  pr.quotes_converted = false;
  pr.quasiquotes_converted = false;
  pr.inline_primitives_converted = false;
  pr.constant_folded = false;
  pr.constant_propagated = false;
  pr.macros_expanded = false;
  pr.single_begins_removed = false;
  pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       pr.quotes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__detail::__variant::
  _Variant_storage<false,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
  ::_Variant_storage<5ul,skiwi::FunCall&>
            ((_Variant_storage<false,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
              *)&er,pvVar4);
  std::
  vector<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>,std::allocator<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>>
  ::
  emplace_back<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>
            ((vector<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>,std::allocator<std::variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>>>
              *)&pr,(variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                     *)&er);
  std::__detail::__variant::
  _Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  ::~_Variant_storage((_Variant_storage<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                       *)&er);
  externals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &externals._M_t._M_impl.super__Rb_tree_header._M_header;
  externals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  externals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  externals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  externals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       externals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  add_system_calls(&externals);
  assembler::asmcode::asmcode(&code);
  assembler::registers::registers((registers *)&er);
  md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &md.m._M_t._M_impl.super__Rb_tree_header._M_header;
  md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  md.m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md.compiled_macros.
  super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  md.compiled_macros.
  super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  md.compiled_macros.
  super__Vector_base<std::pair<void_*,_unsigned_long>,_std::allocator<std::pair<void_*,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       md.m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  compile(this->p_env,this->p_rd,&md,this->p_ctxt,&code,&pr,this->p_pm,&externals,&this->ops);
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  d.size = 0;
  d.data_size = 0;
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       d.label_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       d.external_to_address._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar8 = (code *)assembler::assemble(&fie_size,&d,&code);
  if (pcVar8 == (code *)0x0) {
    q.line_nr = -1;
    q.column_nr = -1;
    q.tail_position = false;
    q.arg._0_8_ = &q.arg.value._M_string_length;
    q.pre_scan_index = 0;
    q.scan_index = 0;
    q.arg.value._M_dataplus._M_p = (pointer)0x0;
    q.arg.value._M_string_length._0_1_ = 0;
    std::
    variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
    ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                 *)e,(Nop *)&q);
    std::__cxx11::string::~string((string *)&q.arg);
  }
  else {
    rax = (*pcVar8)(this->p_ctxt);
    std::__cxx11::stringstream::stringstream((stringstream *)&q);
    std::__shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_df8,
                 &this->p_env->
                  super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                );
    scheme_runtime(rax,(ostream *)&q.pre_scan_index,
                   (shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&local_df8,
                   this->p_rd,this->p_ctxt);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_df8._M_refcount);
    std::__cxx11::stringbuf::str();
    tokenize(&tokens_1,&script);
    std::
    __reverse<__gnu_cxx::__normal_iterator<skiwi::token*,std::vector<skiwi::token,std::allocator<skiwi::token>>>>
              (tokens_1.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
               super__Vector_impl_data._M_start,
               tokens_1.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
               super__Vector_impl_data._M_finish);
    make_program((Program *)&tokens,&tokens_1);
    if (tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
        super__Vector_impl_data._M_start ==
        tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_d00._0_4_ = -1;
      local_d00._4_4_ = -1;
      local_d00._8_8_ = local_d00._8_8_ & 0xffffffffffffff00;
      local_d00._32_8_ = &aStack_cd0;
      local_d00._16_8_ = (pointer)0x0;
      local_d00._24_8_ = (pointer)0x0;
      local_cd8 = 0;
      aStack_cd0._M_allocated_capacity = aStack_cd0._M_allocated_capacity & 0xffffffffffffff00;
      std::
      variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
      ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                   *)e,(Nop *)local_d00);
      std::__cxx11::string::~string((string *)(local_d00 + 0x20));
    }
    else if ((long)tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
                   super__Vector_impl_data._M_start == 0xf0) {
      std::__detail::__variant::
      _Copy_assign_base<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ::operator=((_Copy_assign_base<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                   *)e,(_Copy_assign_base<false,_skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                        *)tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    }
    else {
      aStack_cd0._8_8_ = &local_cb8;
      local_d00._0_4_ = -1;
      local_d00._4_4_ = -1;
      local_d00._32_8_ = local_d00._32_8_ & 0xffffffffffffff00;
      local_cd8 = 0;
      aStack_cd0._M_allocated_capacity = 0;
      local_cc0 = 0;
      local_cb8._M_local_buf[0] = '\0';
      local_d00._8_8_ =
           tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_d00._16_8_ =
           tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_d00._24_8_ =
           tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      tokens.super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
      ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                   *)e,(Begin *)local_d00);
      Begin::~Begin((Begin *)local_d00);
    }
    assembler::free_assembled_function(pcVar8,fie_size);
    Program::~Program((Program *)&tokens);
    std::vector<skiwi::token,_std::allocator<skiwi::token>_>::~vector(&tokens_1);
    std::__cxx11::string::~string((string *)&script);
    std::__cxx11::stringstream::~stringstream((stringstream *)&q);
  }
  assembler::first_pass_data::~first_pass_data(&d);
  macro_data::~macro_data(&md);
  assembler::asmcode::~asmcode(&code);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::external_function>_>_>
  ::~_Rb_tree(&externals._M_t);
  Program::~Program(&pr);
  return false;
}

Assistant:

virtual bool _previsit(Expression& e)
      {
      if (std::holds_alternative<FunCall>(e))
        {
        auto& f = std::get<FunCall>(e);
        if (std::holds_alternative<Variable>(f.fun.front()))
          {
          auto it = p_md->m.find(std::get<Variable>(f.fun.front()).name);
          if (it != p_md->m.end())
            {
            if (!it->second.variable_arity)
              {
              if (it->second.variables.size() != f.arguments.size())
                throw_error(f.line_nr, f.column_nr, f.filename, macro_invalid_pattern, it->first);
              }
            else
              {
              if (it->second.variables.size() > f.arguments.size()+1)
                throw_error(f.line_nr, f.column_nr, f.filename, macro_invalid_pattern, it->first);
              }
            macros_expanded = true;
            for (auto& arg : f.arguments)
              {
              Quote q;
              q.arg = expression_to_cell(arg);
              arg = q;
              }
            Program pr;
            pr.expressions.push_back(f);
            std::map<std::string, external_function> externals;
                add_system_calls(externals);
            asmcode code;
            try
              {
                  registers reg;
              macro_data md; // all macros are in the environment
#ifdef _SKIWI_FOR_ARM
              compile(*p_env, *p_rd, md, *p_ctxt, code, pr, *p_pm, externals, ops);
              auto externals_for_vm = convert_externals_to_vm(externals);
                  first_pass_data d;
                  uint64_t fie_size;
                  uint8_t* fie = (uint8_t*)vm_bytecode(fie_size, d, code);
                  if (fie)
                  {
#ifdef _WIN32
        reg.rcx = (uint64_t)(p_ctxt);
#else
        reg.rdi = (uint64_t)(p_ctxt);
#endif
              run_bytecode(fie, fie_size, reg, externals_for_vm);
                      uint64_t res = reg.rax;
                      std::stringstream str;
                      scheme_runtime(res, str, *p_env, *p_rd, p_ctxt);
                      std::string script = str.str();
                      //printf("%s\n", script.c_str());
                      auto tokens = tokenize(script);
                      std::reverse(tokens.begin(), tokens.end());
                      auto result = make_program(tokens);

                      if (result.expressions.empty())
                        e = Nop();
                      else if (result.expressions.size() == 1)
                        e = result.expressions.front();
                      else
                        {
                        Begin b;
                        b.arguments.swap(result.expressions);
                        e = b;
                        }
                      free_bytecode((void*)fie, fie_size);
                  }
                  else
                    e = Nop();
                  
#else
              compile(*p_env, *p_rd, md, *p_ctxt, code, pr, *p_pm, externals, ops);
              typedef uint64_t(*compiled_fun_ptr)(void*);

              first_pass_data d;
              uint64_t fie_size;
              compiled_fun_ptr fie = (compiled_fun_ptr)assemble(fie_size, d, code);

              if (fie)
                {
                auto res = fie(p_ctxt);
                std::stringstream str;
                scheme_runtime(res, str, *p_env, *p_rd, p_ctxt);
                std::string script = str.str();
                //printf("%s\n", script.c_str());
                auto tokens = tokenize(script);
                std::reverse(tokens.begin(), tokens.end());
                auto result = make_program(tokens);

                if (result.expressions.empty())
                  e = Nop();
                else if (result.expressions.size() == 1)
                  e = result.expressions.front();
                else
                  {
                  Begin b;
                  b.arguments.swap(result.expressions);
                  e = b;
                  }

                free_assembled_function((void*)fie, fie_size);
                }
              else
                e = Nop();
#endif
              }
            catch (std::logic_error er)
              {
              std::cout << er.what() << "\n";
              throw er;
              }
            catch (std::runtime_error er)
              {
              std::cout << er.what() << "\n";
              throw er;
              }

            return false;
            }
          }
        }
      return true;
      }